

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::blend_equationi(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  RenderContext *pRVar3;
  ContextInfo *this;
  NotSupportedError *this_00;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_51;
  string local_50;
  deUint32 local_1c;
  ContextType local_18;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  GLint maxDrawBuffers;
  NegativeTestContext *ctx_local;
  
  local_14 = 0xffffffff;
  pNStack_10 = ctx;
  pRVar3 = NegativeTestContext::getRenderContext(ctx);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports(local_18,(ApiType)local_1c);
  if (!bVar2) {
    this = NegativeTestContext::getContextInfo(pNStack_10);
    bVar2 = glu::ContextInfo::isExtensionSupported(this,"GL_EXT_draw_buffers_indexed");
    if (!bVar2) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"GL_EXT_draw_buffers_indexed is not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fNegativeFragmentApiTests.cpp"
                 ,0xa5);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  glu::CallLogWrapper::glGetIntegerv(&pNStack_10->super_CallLogWrapper,0x8824,(GLint *)&local_14);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "GL_INVALID_ENUM is generated if mode is not GL_FUNC_ADD, GL_FUNC_SUBTRACT, GL_FUNC_REVERSE_SUBTRACT, GL_MAX or GL_MIN."
             ,&local_51);
  NegativeTestContext::beginSection(pNVar1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  glu::CallLogWrapper::glBlendEquationi(&pNStack_10->super_CallLogWrapper,0,0xffffffff);
  NegativeTestContext::expectError(pNStack_10,0x500);
  NegativeTestContext::endSection(pNStack_10);
  pNVar1 = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "GL_INVALID_VALUE is generated if buf is not in the range zero to the value of MAX_DRAW_BUFFERS minus one."
             ,&local_79);
  NegativeTestContext::beginSection(pNVar1,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  glu::CallLogWrapper::glBlendEquationi(&pNStack_10->super_CallLogWrapper,0xffffffff,0x8006);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glBlendEquationi(&pNStack_10->super_CallLogWrapper,local_14,0x8006);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  return;
}

Assistant:

void blend_equationi (NegativeTestContext& ctx)
{
	glw::GLint maxDrawBuffers = -1;

	if (!contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) && !ctx.getContextInfo().isExtensionSupported("GL_EXT_draw_buffers_indexed"))
		throw tcu::NotSupportedError("GL_EXT_draw_buffers_indexed is not supported", DE_NULL, __FILE__, __LINE__);

	ctx.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	ctx.beginSection("GL_INVALID_ENUM is generated if mode is not GL_FUNC_ADD, GL_FUNC_SUBTRACT, GL_FUNC_REVERSE_SUBTRACT, GL_MAX or GL_MIN.");
	ctx.glBlendEquationi(0, -1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
	ctx.beginSection("GL_INVALID_VALUE is generated if buf is not in the range zero to the value of MAX_DRAW_BUFFERS minus one.");
	ctx.glBlendEquationi(-1, GL_FUNC_ADD);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBlendEquationi(maxDrawBuffers, GL_FUNC_ADD);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}